

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,long>
          (TryCast *this,string_t input,int64_t *result,bool strict)

{
  byte bVar1;
  long lVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  IntegerCastData<short> local_86;
  undefined4 local_84;
  undefined8 local_80;
  IntegerDecimalCastData<long> local_78;
  undefined8 local_58;
  undefined8 local_50;
  ulong local_48;
  string_t input_local;
  
  pcVar6 = input.value._0_8_;
  uVar3 = SUB84(result,0);
  pcVar10 = pcVar6;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar10 = input_local.value.pointer.prefix;
  }
  input_local.value.pointer.ptr = pcVar6;
  uVar11 = (ulong)this & 0xffffffff;
  local_84._0_1_ = (byte)result;
  if (uVar11 != 0) {
    uVar8 = 0;
    do {
      bVar1 = pcVar10[uVar8];
      uVar13 = (uint)bVar1;
      if ((4 < uVar13 - 9) && (uVar13 != 0x20)) {
        if (uVar13 == 0x2d) {
          uVar17 = uVar11 - uVar8;
          pcVar6 = (char *)0x0;
          uVar9 = 1;
          goto LAB_00ce20b6;
        }
        if (bVar1 == 0x30 && uVar11 - 1 != uVar8) {
          cVar12 = pcVar10[uVar8 + 1];
          if (cVar12 != 'B') {
            if (cVar12 != 'x') {
              if (cVar12 == 'b') goto LAB_00ce255f;
              if (cVar12 != 'X') {
                if (((byte)local_84 & (byte)(cVar12 - 0x30U) < 10) == 0) goto LAB_00ce2670;
                goto LAB_00ce2684;
              }
            }
            pcVar6 = (char *)0x0;
            uVar9 = 1;
            goto LAB_00ce21f5;
          }
LAB_00ce255f:
          uVar9 = ~uVar8 + uVar11;
          bVar20 = 1 < uVar9;
          if (!bVar20) {
            pcVar6 = (char *)0x0;
            goto LAB_00ce2158;
          }
          pcVar6 = (char *)0x0;
          uVar17 = 1;
          goto LAB_00ce2578;
        }
LAB_00ce2670:
        local_50 = CONCAT44(local_50._4_4_,3);
        if (((byte)local_84 & bVar1 == 0x2b) == 0) {
          local_80 = uVar11 - uVar8;
          local_58 = (ulong)(bVar1 == 0x2b);
          pcVar6 = (char *)0x0;
          uVar9 = local_58;
          goto LAB_00ce26a2;
        }
LAB_00ce2684:
        pcVar6 = (char *)0x0;
        goto LAB_00ce2686;
      }
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  bVar20 = false;
  goto LAB_00ce2158;
  while( true ) {
    uVar19 = uVar9 + 1;
    if ((long)pcVar6 < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar21 = false;
    }
    else {
      pcVar6 = (char *)((long)pcVar6 * 10 - (ulong)bVar1);
      bVar21 = true;
      if ((~uVar9 + uVar11 != uVar8) && (pcVar10[uVar8 + 1 + uVar9] == '_' && (byte)local_84 == 0))
      {
        uVar19 = uVar9 + 2;
        if ((uVar11 - uVar9) - 2 == uVar8) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(pcVar10[uVar8 + uVar19] - 0x30U) < 10;
        }
      }
    }
    bVar20 = false;
    uVar9 = uVar19;
    if (!bVar21) break;
LAB_00ce20b6:
    if (uVar17 <= uVar9) goto LAB_00ce23c4;
    bVar1 = pcVar10[uVar8 + uVar9] - 0x30;
    if (9 < bVar1) {
      if (pcVar10[uVar8 + uVar9] == '.') {
        if ((byte)local_84 != 0) goto LAB_00ce2686;
        uVar19 = uVar9 + 1;
        if (uVar19 < uVar17) {
          iVar5 = 0;
          if (9 < (byte)(pcVar10[uVar8 + 1 + uVar9] - 0x30U)) goto LAB_00ce2a30;
          iVar4 = 1;
        }
        else {
          iVar5 = 3;
LAB_00ce2a30:
          iVar4 = 1;
          if (1 < uVar9) {
            iVar4 = iVar5;
          }
        }
        uVar9 = uVar19;
        if (iVar4 == 3) goto LAB_00ce23c4;
        if (iVar4 != 0) goto LAB_00ce2686;
      }
      bVar20 = false;
      if (((ulong)(byte)pcVar10[uVar8 + uVar9] < 0x21) &&
         (bVar20 = false, (0x100003e00U >> ((ulong)(byte)pcVar10[uVar8 + uVar9] & 0x3f) & 1) != 0))
      {
        uVar19 = uVar9 + 1;
        uVar9 = uVar19;
        if (uVar17 <= uVar19) goto LAB_00ce23c4;
        goto LAB_00ce2634;
      }
      break;
    }
  }
  goto LAB_00ce2158;
  while (uVar19 = uVar19 + 1, uVar9 = uVar17, uVar17 != uVar19) {
LAB_00ce2634:
    if ((0x20 < (ulong)(byte)pcVar10[uVar8 + uVar19]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar10[uVar8 + uVar19] & 0x3f) & 1) == 0))
    goto LAB_00ce2686;
  }
LAB_00ce23c4:
  bVar20 = 1 < uVar9;
  goto LAB_00ce2158;
LAB_00ce21f5:
  do {
    if (~uVar8 + uVar11 <= uVar9) goto LAB_00ce23c4;
    bVar1 = pcVar10[uVar8 + 1 + uVar9];
    bVar18 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar18 = bVar1;
    }
    if (9 < (byte)(bVar18 - 0x30)) {
      bVar20 = false;
      if ((0x25 < bVar18 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar18 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar12 = -0x57;
    if ((char)bVar18 < 'a') {
      cVar12 = -0x30;
    }
    uVar17 = uVar9 + 1;
    if (((uVar11 - uVar9) - 2 == uVar8) || (pcVar10[uVar8 + 2 + uVar9] != '_')) {
LAB_00ce22be:
      bVar21 = (long)pcVar6 <= (long)((ulong)((byte)(cVar12 + bVar18) >> 4) ^ 0x7ffffffffffffff);
      if (bVar21) {
        pcVar6 = (char *)((long)pcVar6 * 0x10 + (ulong)(byte)(cVar12 + bVar18));
      }
    }
    else {
      uVar17 = uVar9 + 2;
      if ((uVar11 - uVar9) - 3 != uVar8) {
        if (9 < (byte)(pcVar10[uVar8 + 3 + uVar9] - 0x30U)) {
          bVar21 = false;
          uVar13 = (byte)pcVar10[uVar8 + 3 + uVar9] - 0x41;
          if ((0x25 < uVar13) || ((0x3f0000003fU >> ((ulong)uVar13 & 0x3f) & 1) == 0))
          goto LAB_00ce22e2;
        }
        goto LAB_00ce22be;
      }
      bVar21 = false;
    }
LAB_00ce22e2:
    bVar20 = false;
    uVar9 = uVar17;
  } while (bVar21);
  goto LAB_00ce2158;
LAB_00ce2578:
  do {
    bVar20 = false;
    uVar19 = 0;
    if ((pcVar10[uVar8 + 1 + uVar17] != '0') && (uVar19 = 1, pcVar10[uVar8 + 1 + uVar17] != '1'))
    break;
    uVar15 = uVar17 + 1;
    if (((uVar11 - uVar17) - 2 != uVar8) && (pcVar10[uVar8 + 2 + uVar17] == '_')) {
      if (((uVar11 - uVar17) - 3 != uVar8) && ((pcVar10[uVar8 + 3 + uVar17] & 0xfeU) == 0x30)) {
        uVar15 = uVar17 + 2;
        goto LAB_00ce25da;
      }
LAB_00ce2c65:
      bVar20 = false;
      break;
    }
LAB_00ce25da:
    uVar17 = uVar15;
    if (0x3fffffffffffffff < (long)pcVar6) goto LAB_00ce2c65;
    pcVar6 = (char *)(uVar19 + (long)pcVar6 * 2);
    bVar20 = true;
  } while (uVar17 < uVar9);
  goto LAB_00ce2158;
  while( true ) {
    uVar17 = uVar9 + 1;
    bVar21 = false;
    if ((long)pcVar6 <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      pcVar6 = (char *)((long)pcVar6 * 10 + (ulong)bVar1);
      bVar21 = true;
      if ((~uVar9 + uVar11 != uVar8) && (pcVar10[uVar8 + 1 + uVar9] == '_' && (byte)local_84 == 0))
      {
        uVar17 = uVar9 + 2;
        if ((uVar11 - uVar9) - 2 == uVar8) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(pcVar10[uVar8 + uVar17] - 0x30U) < 10;
        }
      }
    }
    bVar20 = false;
    uVar9 = uVar17;
    if (!bVar21) break;
LAB_00ce26a2:
    if (local_80 <= uVar9) goto LAB_00ce2870;
    bVar1 = pcVar10[uVar8 + uVar9] - 0x30;
    if (9 < bVar1) {
      if (pcVar10[uVar8 + uVar9] == '.') {
        if ((byte)local_84 != 0) {
          bVar20 = false;
          break;
        }
        uVar17 = uVar9 + 1;
        if ((uVar17 < local_80) &&
           (local_50 = (ulong)local_50._4_4_ << 0x20,
           (byte)(pcVar10[uVar8 + 1 + uVar9] - 0x30U) < 10)) {
          iVar5 = 1;
        }
        else {
          iVar5 = 1;
          if (local_58 < uVar9) {
            iVar5 = (int)local_50;
          }
        }
        uVar9 = uVar17;
        if (iVar5 == 3) goto LAB_00ce2870;
        if (iVar5 != 0) goto LAB_00ce2686;
      }
      bVar20 = false;
      if (((ulong)(byte)pcVar10[uVar8 + uVar9] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar10[uVar8 + uVar9] & 0x3f) & 1) != 0)) {
        uVar17 = uVar9 + 1;
        uVar9 = uVar17;
        if (local_80 <= uVar17) goto LAB_00ce2870;
        goto LAB_00ce29fd;
      }
      break;
    }
  }
  goto LAB_00ce2158;
LAB_00ce2686:
  bVar20 = false;
  goto LAB_00ce2158;
  while( true ) {
    uVar19 = uVar17 + 1;
    if (local_78.result < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar20 = false;
    }
    else {
      local_78.result = local_78.result * 10 - (ulong)bVar1;
      bVar20 = true;
      if ((~uVar17 + uVar11 != uVar8) && (pcVar10[uVar8 + 1 + uVar17] == '_' && (byte)local_84 == 0)
         ) {
        uVar19 = uVar17 + 2;
        if ((uVar11 - uVar17) - 2 == uVar8) {
          bVar20 = false;
        }
        else {
          bVar20 = (byte)(pcVar10[uVar8 + uVar19] - 0x30U) < 10;
        }
      }
    }
    uVar17 = uVar19;
    if (!bVar20) break;
LAB_00ce231e:
    if (uVar9 <= uVar17) goto LAB_00ce2777;
    bVar1 = pcVar10[uVar8 + uVar17] - 0x30;
    if (9 < bVar1) {
      if (pcVar10[uVar8 + uVar17] != '.') goto LAB_00ce2979;
      if ((byte)local_84 == 0) {
        uVar19 = uVar17 + 1;
        if (uVar9 <= uVar19) {
          iVar4 = 3;
          uVar14 = uVar19;
          goto LAB_00ce2dd0;
        }
        local_78.decimal = 0;
        local_80 = CONCAT44(local_80._4_4_,3);
        uVar15 = uVar19;
        goto LAB_00ce27d8;
      }
      break;
    }
  }
  goto LAB_00ce218c;
  while( true ) {
    if (local_78.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_78.decimal_digits = local_78.decimal_digits + 1;
      local_78.decimal = local_78.decimal * 10 + (ulong)bVar1;
    }
    uVar14 = uVar15 + 1;
    if (((~uVar15 + uVar11 != uVar8) && (pcVar10[uVar8 + 1 + uVar15] == '_')) &&
       ((uVar14 = uVar15 + 2, (uVar11 - uVar15) - 2 == uVar8 ||
        (9 < (byte)(pcVar10[uVar8 + uVar14] - 0x30U))))) {
      local_78._18_6_ = 0;
      iVar5 = 1;
      goto LAB_00ce2de3;
    }
    uVar15 = uVar14;
    if (uVar9 <= uVar14) break;
LAB_00ce27d8:
    bVar1 = pcVar10[uVar8 + uVar15] - 0x30;
    local_50 = uVar19;
    if (9 < bVar1) {
      local_80 = (ulong)local_80._4_4_ << 0x20;
      uVar14 = uVar15;
      break;
    }
  }
  local_78._18_6_ = 0;
  iVar4 = (int)local_80;
LAB_00ce2dd0:
  iVar5 = 1;
  if (uVar19 < uVar14) {
    iVar5 = iVar4;
  }
  if (1 < uVar17) {
    iVar5 = iVar4;
  }
LAB_00ce2de3:
  uVar17 = uVar14;
  if (iVar5 == 3) {
LAB_00ce2777:
    bVar20 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                       (&local_78);
    if (bVar20) {
      bVar21 = 1 < uVar17;
      goto LAB_00ce218e;
    }
  }
  else if (iVar5 == 0) {
LAB_00ce2979:
    bVar1 = pcVar10[uVar8 + uVar17];
    if (bVar1 - 9 < 5) {
LAB_00ce298d:
      uVar11 = uVar17 + 1;
      uVar17 = uVar11;
      if (uVar11 < uVar9) {
        do {
          if ((0x20 < (ulong)(byte)pcVar10[uVar8 + uVar11]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar10[uVar8 + uVar11] & 0x3f) & 1) == 0))
          goto LAB_00ce218c;
          uVar11 = uVar11 + 1;
          uVar17 = uVar9;
        } while (uVar9 != uVar11);
      }
      goto LAB_00ce2777;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar17 != 1 && (byte)local_84 == 0) && (uVar17 + 1 < uVar9)) {
        local_86.result = 0;
        pcVar10 = pcVar10 + uVar8 + uVar17 + 1;
        iVar7 = ~uVar8 + (uVar11 - uVar17);
        if (*pcVar10 == '-') {
          bVar20 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar10,iVar7,&local_86,false);
        }
        else {
          bVar20 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar10,iVar7,&local_86,false);
        }
        bVar21 = false;
        if (bVar20 != false) {
          bVar21 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<long>,true>
                             (&local_78,local_86.result);
        }
        goto LAB_00ce218e;
      }
    }
    else if (bVar1 == 0x20) goto LAB_00ce298d;
  }
  goto LAB_00ce218c;
  while( true ) {
    if (0x3fffffffffffffff < local_78.result) goto LAB_00ce218c;
    local_78.result = uVar19 + local_78.result * 2;
    uVar17 = uVar15;
    if (uVar9 <= uVar15) break;
LAB_00ce28c0:
    if (pcVar10[uVar8 + 1 + uVar17] == '0') {
      uVar19 = 0;
    }
    else {
      uVar19 = 1;
      if (pcVar10[uVar8 + 1 + uVar17] != '1') goto LAB_00ce218c;
    }
    uVar15 = uVar17 + 1;
    if (((uVar11 - uVar17) - 2 != uVar8) && (pcVar10[uVar8 + 2 + uVar17] == '_')) {
      if (((uVar11 - uVar17) - 3 == uVar8) || ((pcVar10[uVar8 + 3 + uVar17] & 0xfeU) != 0x30))
      goto LAB_00ce218c;
      uVar15 = uVar17 + 2;
    }
  }
LAB_00ce295b:
  bVar21 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                     (&local_78);
  bVar21 = bVar21 && 1 < uVar9;
  goto LAB_00ce218e;
LAB_00ce2459:
  do {
    if (~uVar8 + uVar11 <= uVar9) {
      bVar21 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                         (&local_78);
      bVar21 = 1 < uVar9 && bVar21;
      goto LAB_00ce218e;
    }
    bVar1 = pcVar10[uVar8 + 1 + uVar9];
    bVar18 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar18 = bVar1;
    }
    if ((9 < (byte)(bVar18 - 0x30)) &&
       ((0x25 < bVar18 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar18 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar12 = -0x57;
    if ((char)bVar18 < 'a') {
      cVar12 = -0x30;
    }
    uVar17 = uVar9 + 1;
    if (((uVar11 - uVar9) - 2 == uVar8) || (pcVar10[uVar8 + 2 + uVar9] != '_')) {
LAB_00ce2525:
      uVar9 = (ulong)((byte)(cVar12 + bVar18) >> 4) ^ 0x7ffffffffffffff;
      lVar2 = local_78.result;
      if (local_78.result <= (long)uVar9) {
        lVar2 = local_78.result * 0x10 + (ulong)(byte)(cVar12 + bVar18);
      }
      bVar20 = local_78.result <= (long)uVar9;
      local_78.result = lVar2;
    }
    else {
      uVar17 = uVar9 + 2;
      if ((uVar11 - uVar9) - 3 != uVar8) {
        if (9 < (byte)(pcVar10[uVar8 + 3 + uVar9] - 0x30U)) {
          uVar13 = (byte)pcVar10[uVar8 + 3 + uVar9] - 0x41;
          bVar20 = false;
          if ((0x25 < uVar13) ||
             (bVar20 = false, (0x3f0000003fU >> ((ulong)uVar13 & 0x3f) & 1) == 0))
          goto LAB_00ce254a;
        }
        goto LAB_00ce2525;
      }
      bVar20 = false;
    }
LAB_00ce254a:
    uVar9 = uVar17;
  } while (bVar20);
  bVar21 = false;
  goto LAB_00ce218e;
  while( true ) {
    uVar15 = uVar17 + 1;
    bVar20 = false;
    if (local_78.result <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_78.result = local_78.result * 10 + (ulong)bVar1;
      bVar20 = true;
      if ((~uVar17 + uVar11 != uVar8) && (pcVar10[uVar8 + 1 + uVar17] == '_' && (byte)local_84 == 0)
         ) {
        uVar15 = uVar17 + 2;
        if ((uVar11 - uVar17) - 2 == uVar8) {
          bVar20 = false;
        }
        else {
          bVar20 = (byte)(pcVar10[uVar8 + uVar15] - 0x30U) < 10;
        }
      }
    }
    uVar17 = uVar15;
    if (!bVar20) break;
LAB_00ce2a85:
    local_80 = uVar19;
    if (uVar9 <= uVar17) goto LAB_00ce2b66;
    bVar1 = pcVar10[uVar8 + uVar17] - 0x30;
    if (9 < bVar1) {
      if (pcVar10[uVar8 + uVar17] != '.') goto LAB_00ce2cf4;
      if ((byte)local_84 == 0) {
        uVar15 = uVar17 + 1;
        if (uVar9 <= uVar15) {
          iVar4 = 3;
          uVar16 = uVar15;
          goto LAB_00ce2eaa;
        }
        local_78.decimal = 0;
        iVar5 = 0;
        local_58 = CONCAT44(local_58._4_4_,3);
        uVar14 = uVar15;
        goto LAB_00ce2bc9;
      }
      break;
    }
  }
  goto LAB_00ce218c;
  while( true ) {
    local_50 = CONCAT44(local_50._4_4_,iVar5);
    if (local_78.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      iVar5 = iVar5 + 1;
      local_78.decimal = local_78.decimal * 10 + (ulong)bVar1;
    }
    uVar16 = uVar14 + 1;
    if (((~uVar14 + uVar11 != uVar8) && (pcVar10[uVar8 + 1 + uVar14] == '_')) &&
       ((uVar16 = uVar14 + 2, (uVar11 - uVar14) - 2 == uVar8 ||
        (9 < (byte)(pcVar10[uVar8 + uVar16] - 0x30U))))) {
      local_78._18_6_ = 0;
      local_78.decimal_digits = (ushort)iVar5;
      iVar5 = 1;
      goto LAB_00ce2ec1;
    }
    uVar14 = uVar16;
    if (uVar9 <= uVar16) break;
LAB_00ce2bc9:
    bVar1 = pcVar10[uVar8 + uVar14] - 0x30;
    local_48 = uVar15;
    if (9 < bVar1) {
      local_58 = (ulong)local_58._4_4_ << 0x20;
      uVar16 = uVar14;
      break;
    }
  }
  local_78._18_6_ = 0;
  local_78.decimal_digits = (ushort)iVar5;
  iVar4 = (int)local_58;
LAB_00ce2eaa:
  iVar5 = 1;
  if (uVar15 < uVar16) {
    iVar5 = iVar4;
  }
  if (uVar19 < uVar17) {
    iVar5 = iVar4;
  }
LAB_00ce2ec1:
  uVar17 = uVar16;
  if (iVar5 == 3) {
LAB_00ce2b66:
    bVar20 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                       (&local_78);
    if (bVar20) {
      bVar21 = uVar19 < uVar17;
      goto LAB_00ce218e;
    }
  }
  else if (iVar5 == 0) {
LAB_00ce2cf4:
    bVar1 = pcVar10[uVar8 + uVar17];
    if (bVar1 - 9 < 5) {
LAB_00ce2d08:
      uVar11 = uVar17 + 1;
      uVar17 = uVar11;
      if (uVar11 < uVar9) {
        do {
          if ((0x20 < (ulong)(byte)pcVar10[uVar8 + uVar11]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar10[uVar8 + uVar11] & 0x3f) & 1) == 0))
          goto LAB_00ce218c;
          uVar11 = uVar11 + 1;
          uVar17 = uVar9;
        } while (uVar9 != uVar11);
      }
      goto LAB_00ce2b66;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar17 != uVar19 && (byte)local_84 == 0) && (uVar17 + 1 < uVar9)) {
        local_86.result = 0;
        pcVar10 = pcVar10 + uVar8 + uVar17 + 1;
        iVar7 = ~uVar8 + (uVar11 - uVar17);
        if (*pcVar10 == '-') {
          bVar20 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar10,iVar7,&local_86,false);
        }
        else {
          bVar20 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar10,iVar7,&local_86,false);
        }
        bVar21 = false;
        if (bVar20 != false) {
          bVar21 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<long>,false>
                             (&local_78,local_86.result);
        }
        goto LAB_00ce218e;
      }
    }
    else if (bVar1 == 0x20) goto LAB_00ce2d08;
  }
  goto LAB_00ce218c;
  while (uVar17 = uVar17 + 1, uVar9 = local_80, local_80 != uVar17) {
LAB_00ce29fd:
    if ((0x20 < (ulong)(byte)pcVar10[uVar8 + uVar17]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar10[uVar8 + uVar17] & 0x3f) & 1) == 0))
    goto LAB_00ce2686;
  }
LAB_00ce2870:
  bVar20 = local_58 < uVar9;
LAB_00ce2158:
  if (bVar20) {
    *input.value._8_8_ = (long)pcVar6;
    bVar21 = true;
  }
  else {
    if (uVar11 != 0) {
      uVar8 = 0;
      do {
        bVar1 = pcVar10[uVar8];
        if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          local_78._16_8_ = 0;
          local_78.result = 0;
          local_78.decimal = 0;
          uVar9 = uVar11 - uVar8;
          local_78.decimal_digits = 0;
          local_84 = uVar3;
          input_local.value._0_8_ = this;
          if (bVar1 == 0x2d) {
            local_78.result = 0;
            uVar17 = 1;
            goto LAB_00ce231e;
          }
          if (bVar1 == 0x30 && uVar11 - 1 != uVar8) {
            cVar12 = pcVar10[uVar8 + 1];
            if (cVar12 == 'B') {
LAB_00ce28a2:
              uVar9 = ~uVar8 + uVar11;
              if (uVar9 < 2) goto LAB_00ce295b;
              local_78.result = 0;
              uVar17 = 1;
              goto LAB_00ce28c0;
            }
            if (cVar12 != 'x') {
              if (cVar12 == 'b') goto LAB_00ce28a2;
              if (cVar12 != 'X') {
                if (((byte)local_84 & (byte)(cVar12 - 0x30U) < 10) == 0) goto LAB_00ce2a63;
                break;
              }
            }
            local_78.result = 0;
            uVar9 = 1;
            goto LAB_00ce2459;
          }
LAB_00ce2a63:
          if (((byte)local_84 & bVar1 == 0x2b) == 0) {
            uVar19 = (ulong)(bVar1 == 0x2b);
            local_78.result = 0;
            uVar17 = uVar19;
            goto LAB_00ce2a85;
          }
          break;
        }
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
    }
LAB_00ce218c:
    bVar21 = false;
LAB_00ce218e:
    if (bVar21 != false) {
      *input.value._8_8_ = local_78.result;
    }
  }
  return bVar21;
}

Assistant:

bool TryCast::Operation(string_t input, int64_t &result, bool strict) {
	return TrySimpleIntegerCast<int64_t>(input.GetData(), input.GetSize(), result, strict);
}